

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QFontEngine *
QFontDatabasePrivate::loadSingleEngine
          (int script,QFontDef *request,QtFontFamily *family,QtFontFoundry *foundry,
          QtFontStyle *style,QtFontSize *size)

{
  ushort uVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  QFontCache *this;
  QFontEngine *this_00;
  ulong uVar9;
  QFontEngine *pQVar10;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  uchar c;
  undefined8 *puVar14;
  QFontDef *pQVar15;
  Key *pKVar16;
  byte bVar17;
  uint uVar18;
  long in_FS_OFFSET;
  char local_130 [24];
  char *local_118;
  QFontDef local_110;
  Key key;
  long *plVar8;
  
  bVar17 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  uVar1 = *(ushort *)&size->field_0x8;
  uVar18 = (uint)uVar1;
  if ((uVar1 == 0) ||
     (((uVar1 == 0xffff && ((*(uint *)&style->field_0x4 & 2) != 0)) ||
      (cVar3 = (**(code **)(*plVar8 + 0x80))(plVar8), cVar3 != '\0')))) {
    uVar18 = (uint)request->pixelSize;
  }
  puVar14 = &DAT_005f6e10;
  pQVar15 = &local_110;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pQVar15->families).d.d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    pQVar15 = (QFontDef *)((long)pQVar15 + (ulong)bVar17 * -0x10 + 8);
  }
  QFontDef::QFontDef(&local_110,request);
  local_110.pixelSize = (qreal)(int)uVar18;
  this = QFontCache::instance();
  puVar14 = &DAT_005f6da0;
  pKVar16 = &key;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pKVar16->def).families.d.d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    pKVar16 = (Key *)((long)pKVar16 + (ulong)bVar17 * -0x10 + 8);
  }
  c = (uchar)script;
  QFontCache::Key::Key(&key,&local_110,c,false);
  this_00 = QFontCache::findEngine(this,&key);
  if (this_00 != (QFontEngine *)0x0) goto LAB_004267e8;
  if (script == 2) {
    bVar5 = true;
    bVar17 = 0;
LAB_0042662c:
    uVar18 = (uint)*(uint3 *)&style->key;
    if ((uVar18 < 0x1000) ||
       (uVar7 = (uint)*(ulong *)&request->field_0x60,
       (*(ulong *)&request->field_0x60 & 0xfff0000) == 0)) {
LAB_004266b2:
      if ((*(ushort *)&request->field_0x62 & 0xfff) == 0) {
        uVar9 = 0x640000;
        goto LAB_004266ca;
      }
    }
    else {
      if ((request->styleName).d.size != 0) {
        bVar4 = ::operator!=(&request->styleName,&style->styleName);
        if (!bVar4) goto LAB_004266b2;
        uVar7 = (uint)*(undefined8 *)&request->field_0x60;
        uVar18 = (uint)*(uint3 *)&style->key;
      }
      uVar12 = (int)(uVar18 << 8) >> 0x14;
      uVar9 = (ulong)(((int)((int)(short)((int)((uint)(ushort)((short)(uVar18 >> 8) >> 0xf) << 0x10
                                               | uVar12 & 0xffff) / 2) +
                            (uVar7 >> 0x10 & 0xfff) * 100) / (int)uVar12 & 0xfffU) << 0x10);
LAB_004266ca:
      local_110._96_8_ = local_110._96_8_ & 0xfffffffff000ffff | uVar9;
    }
    this_00 = (QFontEngine *)(**(code **)(*plVar8 + 0x40))(plVar8,&local_110,size->handle);
    if (this_00 != (QFontEngine *)0x0) {
      if ((!bVar5) || (bVar5 = QFontEngine::supportsScript(this_00,script), bVar5)) {
        this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
        QFontCache::insertEngine(this,&key,this_00,false);
        if ((bVar17 == 0) || (this_00->symbol != false)) goto LAB_004267e8;
        key.script = '\x02';
        pQVar10 = QFontCache::findEngine(this,&key);
        if (pQVar10 != (QFontEngine *)0x0) goto LAB_004267e8;
LAB_0042676b:
        QFontCache::insertEngine(this,&key,this_00,false);
        goto LAB_004267e8;
      }
      QtPrivateLogging::lcFontDb();
      if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base.
                 _M_i & 1) != 0) {
        local_130[0] = '\x02';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[0x14] = '\0';
        local_130[0x15] = '\0';
        local_130[0x16] = '\0';
        local_130[0x17] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = '\0';
        local_130[9] = '\0';
        local_130[10] = '\0';
        local_130[0xb] = '\0';
        local_130[0xc] = '\0';
        local_130[0xd] = '\0';
        local_130[0xe] = '\0';
        local_130[0xf] = '\0';
        local_130[0x10] = '\0';
        local_130[0x11] = '\0';
        local_130[0x12] = '\0';
        local_130[0x13] = '\0';
        local_118 = QtPrivateLogging::lcFontDb::category.name;
        uVar11 = QString::utf16();
        QMessageLogger::info
                  (local_130,"OpenType support missing for \"%ls\", script %d",uVar11,
                   (ulong)(uint)script);
      }
      if ((this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_QFontEngine[1])(this_00);
      }
    }
  }
  else {
    bVar17 = family->writingSystems[1] & 1;
    bVar5 = script < 0xab;
    if ((0xaa < script) || (bVar17 == 0)) goto LAB_0042662c;
    key.script = '\x02';
    this_00 = QFontCache::findEngine(this,&key);
    key.script = c;
    if (this_00 == (QFontEngine *)0x0) {
      bVar5 = true;
      bVar17 = 1;
      goto LAB_0042662c;
    }
    bVar5 = QFontEngine::supportsScript(this_00,script);
    if (bVar5) {
      this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
      goto LAB_0042676b;
    }
    QtPrivateLogging::lcFontDb();
    if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base._M_i
        & 1) != 0) {
      local_130[0] = '\x02';
      local_130[1] = '\0';
      local_130[2] = '\0';
      local_130[3] = '\0';
      local_130[0x14] = '\0';
      local_130[0x15] = '\0';
      local_130[0x16] = '\0';
      local_130[0x17] = '\0';
      local_130[4] = '\0';
      local_130[5] = '\0';
      local_130[6] = '\0';
      local_130[7] = '\0';
      local_130[8] = '\0';
      local_130[9] = '\0';
      local_130[10] = '\0';
      local_130[0xb] = '\0';
      local_130[0xc] = '\0';
      local_130[0xd] = '\0';
      local_130[0xe] = '\0';
      local_130[0xf] = '\0';
      local_130[0x10] = '\0';
      local_130[0x11] = '\0';
      local_130[0x12] = '\0';
      local_130[0x13] = '\0';
      local_118 = QtPrivateLogging::lcFontDb::category.name;
      uVar11 = QString::utf16();
      this_00 = (QFontEngine *)0x0;
      QMessageLogger::info
                (local_130,"OpenType support missing for \"%ls\", script %d",uVar11,
                 (ulong)(uint)script);
      goto LAB_004267e8;
    }
  }
  this_00 = (QFontEngine *)0x0;
LAB_004267e8:
  QFontDef::~QFontDef(&key.def);
  QFontDef::~QFontDef(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QFontEngine *QFontDatabasePrivate::loadSingleEngine(int script,
                              const QFontDef &request,
                              QtFontFamily *family, QtFontFoundry *foundry,
                              QtFontStyle *style, QtFontSize *size)
{
    Q_UNUSED(foundry);

    Q_ASSERT(size);
    QPlatformFontDatabase *pfdb = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    int pixelSize = size->pixelSize;
    if (!pixelSize || (style->smoothScalable && pixelSize == SMOOTH_SCALABLE)
        || pfdb->fontsAlwaysScalable()) {
        pixelSize = request.pixelSize;
    }

    QFontDef def = request;
    def.pixelSize = pixelSize;

    QFontCache *fontCache = QFontCache::instance();

    QFontCache::Key key(def,script);
    QFontEngine *engine = fontCache->findEngine(key);
    if (!engine) {
        const bool cacheForCommonScript = script != QFontDatabasePrivate::Script_Common
                && (family->writingSystems[QFontDatabase::Latin] & QtFontFamily::Supported) != 0;

        if (Q_LIKELY(cacheForCommonScript) && script < QChar::ScriptCount) {
            // fast path: check if engine was loaded for another script
            key.script = QChar::Script_Common;
            engine = fontCache->findEngine(key);
            key.script = script;
            if (engine) {
                // Also check for OpenType tables when using complex scripts
                if (Q_UNLIKELY(!engine->supportsScript(QChar::Script(script)))) {
                    qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                           qUtf16Printable(def.families.constFirst()), script);
                    return nullptr;
                }

                engine->isSmoothlyScalable = style->smoothScalable;
                fontCache->insertEngine(key, engine);
                return engine;
            }
        }

        // To avoid synthesized stretch we need a matching stretch to be 100 after this point.
        // If stretch didn't match exactly we need to calculate the new stretch factor.
        // This only done if not matched by styleName.
        if (style->key.stretch != 0 && request.stretch != 0
            && (request.styleName.isEmpty() || request.styleName != style->styleName)) {
            def.stretch = (request.stretch * 100 + style->key.stretch / 2) / style->key.stretch;
        } else if (request.stretch == QFont::AnyStretch) {
            def.stretch = 100;
        }

        engine = pfdb->fontEngine(def, size->handle);
        if (engine) {
            // Also check for OpenType tables when using complex scripts
            if (script < QChar::ScriptCount && !engine->supportsScript(QChar::Script(script))) {
                qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                       qUtf16Printable(def.families.constFirst()), script);
                if (engine->ref.loadRelaxed() == 0)
                    delete engine;
                return nullptr;
            }

            engine->isSmoothlyScalable = style->smoothScalable;
            fontCache->insertEngine(key, engine);

            if (Q_LIKELY(cacheForCommonScript && !engine->symbol)) {
                // cache engine for Common script as well
                key.script = QChar::Script_Common;
                if (!fontCache->findEngine(key))
                    fontCache->insertEngine(key, engine);
            }
        }
    }
    return engine;
}